

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void embree::SceneGraph::extend_animation
               (Ref<embree::SceneGraph::Node> *node0,Ref<embree::SceneGraph::Node> *node1)

{
  Node *pNVar1;
  Node *pNVar2;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *pvVar3;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *pvVar4;
  bool bVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  long *plVar10;
  long *plVar11;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  runtime_error *prVar15;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *pvVar16;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *pvVar17;
  ulong uVar18;
  Ref<embree::SceneGraph::Node> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar1 = node0->ptr;
  if (pNVar1 != node1->ptr) {
    if (pNVar1 == (Node *)0x0) {
      plVar6 = (long *)0x0;
    }
    else {
      plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo,0);
    }
    if (plVar6 == (long *)0x0) {
      if (node0->ptr == (Node *)0x0) {
        plVar7 = (long *)0x0;
      }
      else {
        plVar7 = (long *)__dynamic_cast(node0->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      if (plVar7 == (long *)0x0) {
        if (node0->ptr == (Node *)0x0) {
          plVar8 = (long *)0x0;
        }
        else {
          plVar8 = (long *)__dynamic_cast(node0->ptr,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        }
        if (plVar8 == (long *)0x0) {
          if (node0->ptr == (Node *)0x0) {
            plVar10 = (long *)0x0;
          }
          else {
            plVar10 = (long *)__dynamic_cast(node0->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          }
          if (plVar10 == (long *)0x0) {
            if (node0->ptr == (Node *)0x0) {
              plVar11 = (long *)0x0;
            }
            else {
              plVar11 = (long *)__dynamic_cast(node0->ptr,&Node::typeinfo,&HairSetNode::typeinfo,0);
            }
            if (plVar11 == (long *)0x0) {
              if (node0->ptr == (Node *)0x0) {
                plVar12 = (long *)0x0;
              }
              else {
                plVar12 = (long *)__dynamic_cast(node0->ptr,&Node::typeinfo,&PointSetNode::typeinfo,
                                                 0);
              }
              if (plVar12 == (long *)0x0) {
                if (node0->ptr == (Node *)0x0) {
                  plVar13 = (long *)0x0;
                }
                else {
                  plVar13 = (long *)__dynamic_cast(node0->ptr,&Node::typeinfo,
                                                   &SubdivMeshNode::typeinfo,0);
                }
                if (plVar13 != (long *)0x0) {
                  (**(code **)(*plVar13 + 0x10))(plVar13);
                  if (node1->ptr == (Node *)0x0) {
                    plVar14 = (long *)0x0;
                  }
                  else {
                    plVar14 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,
                                                     &SubdivMeshNode::typeinfo,0);
                  }
                  if (plVar14 == (long *)0x0) {
                    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
LAB_0014c53c:
                    __cxa_throw(prVar15,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  (**(code **)(*plVar14 + 0x10))(plVar14);
                  if (*(long *)(plVar13[0xe] + 8) != *(long *)(plVar14[0xe] + 8)) {
                    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
                    goto LAB_0014c53c;
                  }
                  bVar5 = std::operator!=((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                          (plVar13 + 0x22),
                                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                          (plVar14 + 0x22));
                  if (bVar5) {
                    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
                    goto LAB_0014c53c;
                  }
                  pvVar17 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                             *)plVar14[0xe];
                  pvVar3 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                            *)plVar14[0xf];
                  if (pvVar17 != pvVar3) {
                    do {
                      std::
                      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                      ::
                      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                                  *)(plVar13 + 0xe),pvVar17);
                      pvVar17 = pvVar17 + 1;
                    } while (pvVar17 != pvVar3);
                  }
                  (**(code **)(*plVar14 + 0x18))(plVar14);
                }
                if (plVar13 != (long *)0x0) {
                  (**(code **)(*plVar13 + 0x18))(plVar13);
                }
              }
              else {
                (**(code **)(*plVar12 + 0x10))(plVar12);
                if (node1->ptr == (Node *)0x0) {
                  plVar13 = (long *)0x0;
                }
                else {
                  plVar13 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,
                                                   &PointSetNode::typeinfo,0);
                }
                if (plVar13 == (long *)0x0) {
                  prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
LAB_0014c4ce:
                  __cxa_throw(prVar15,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                (**(code **)(*plVar13 + 0x10))(plVar13);
                pvVar16 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                           *)plVar13[0xf];
                if (*(size_t *)(plVar12[0xf] + 8) != pvVar16->size_active) {
                  prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
                  goto LAB_0014c4ce;
                }
                pvVar4 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                          *)plVar13[0x10];
                if (pvVar16 != pvVar4) {
                  do {
                    std::
                    vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                    ::
                    emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                              ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                                *)(plVar12 + 0xf),pvVar16);
                    pvVar16 = pvVar16 + 1;
                  } while (pvVar16 != pvVar4);
                }
                (**(code **)(*plVar13 + 0x18))(plVar13);
              }
              if (plVar12 != (long *)0x0) {
                (**(code **)(*plVar12 + 0x18))();
              }
            }
            else {
              (**(code **)(*plVar11 + 0x10))(plVar11);
              if (node1->ptr == (Node *)0x0) {
                plVar12 = (long *)0x0;
              }
              else {
                plVar12 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,&HairSetNode::typeinfo,0
                                                );
              }
              if (plVar12 == (long *)0x0) {
                prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
LAB_0014c47e:
                __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              (**(code **)(*plVar12 + 0x10))(plVar12);
              pvVar16 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                         *)plVar12[0xf];
              if (*(size_t *)(plVar11[0xf] + 8) != pvVar16->size_active) {
                prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
                goto LAB_0014c47e;
              }
              pvVar4 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *
                       )plVar12[0x10];
              if (pvVar16 != pvVar4) {
                do {
                  std::
                  vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  ::
                  emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                            ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                              *)(plVar11 + 0xf),pvVar16);
                  pvVar16 = pvVar16 + 1;
                } while (pvVar16 != pvVar4);
              }
              (**(code **)(*plVar12 + 0x18))(plVar12);
            }
            if (plVar11 != (long *)0x0) {
              (**(code **)(*plVar11 + 0x18))(plVar11);
            }
          }
          else {
            (**(code **)(*plVar10 + 0x10))(plVar10);
            if (node1->ptr == (Node *)0x0) {
              plVar11 = (long *)0x0;
            }
            else {
              plVar11 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo,0)
              ;
            }
            if (plVar11 == (long *)0x0) {
              prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
LAB_0014c42e:
              __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            (**(code **)(*plVar11 + 0x10))(plVar11);
            pvVar17 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                      plVar11[0xe];
            if (*(size_t *)(plVar10[0xe] + 8) != pvVar17->size_active) {
              prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
              goto LAB_0014c42e;
            }
            pvVar3 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                     plVar11[0xf];
            if (pvVar17 != pvVar3) {
              do {
                std::
                vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                ::
                emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                          ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                            *)(plVar10 + 0xe),pvVar17);
                pvVar17 = pvVar17 + 1;
              } while (pvVar17 != pvVar3);
            }
            (**(code **)(*plVar11 + 0x18))(plVar11);
          }
          if (plVar10 != (long *)0x0) {
            (**(code **)(*plVar10 + 0x18))(plVar10);
          }
        }
        else {
          (**(code **)(*plVar8 + 0x10))(plVar8);
          if (node1->ptr == (Node *)0x0) {
            plVar10 = (long *)0x0;
          }
          else {
            plVar10 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,&TriangleMeshNode::typeinfo,
                                             0);
          }
          if (plVar10 == (long *)0x0) {
            prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
LAB_0014c3de:
            __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          (**(code **)(*plVar10 + 0x10))(plVar10);
          pvVar17 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                    plVar10[0xe];
          if (*(size_t *)(plVar8[0xe] + 8) != pvVar17->size_active) {
            prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
            goto LAB_0014c3de;
          }
          pvVar3 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                   plVar10[0xf];
          if (pvVar17 != pvVar3) {
            do {
              std::
              vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              ::
              emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                        ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                          *)(plVar8 + 0xe),pvVar17);
              pvVar17 = pvVar17 + 1;
            } while (pvVar17 != pvVar3);
          }
          (**(code **)(*plVar10 + 0x18))(plVar10);
        }
        if (plVar8 != (long *)0x0) {
          (**(code **)(*plVar8 + 0x18))(plVar8);
        }
      }
      else {
        (**(code **)(*plVar7 + 0x10))(plVar7);
        if (node1->ptr == (Node *)0x0) {
          plVar8 = (long *)0x0;
        }
        else {
          plVar8 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
        }
        if (plVar8 == (long *)0x0) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
LAB_0014c38e:
          __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        (**(code **)(*plVar8 + 0x10))(plVar8);
        if (plVar7[0xe] - plVar7[0xd] != plVar8[0xe] - plVar8[0xd]) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
          goto LAB_0014c38e;
        }
        lVar9 = plVar7[0xd];
        if (plVar7[0xe] != lVar9) {
          uVar18 = 0;
          do {
            pNVar1 = *(Node **)(lVar9 + uVar18 * 8);
            local_48.ptr = pNVar1;
            if (pNVar1 != (Node *)0x0) {
              (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
            }
            pNVar2 = *(Node **)(plVar8[0xd] + uVar18 * 8);
            local_50.ptr = pNVar2;
            if (pNVar2 != (Node *)0x0) {
              (*(pNVar2->super_RefCount)._vptr_RefCount[2])(pNVar2);
            }
            extend_animation(&local_48,&local_50);
            if (pNVar2 != (Node *)0x0) {
              (*(pNVar2->super_RefCount)._vptr_RefCount[3])(pNVar2);
            }
            if (pNVar1 != (Node *)0x0) {
              (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
            }
            uVar18 = uVar18 + 1;
            lVar9 = plVar7[0xd];
          } while (uVar18 < (ulong)(plVar7[0xe] - lVar9 >> 3));
        }
        (**(code **)(*plVar8 + 0x18))(plVar8);
      }
      if (plVar7 != (long *)0x0) {
        (**(code **)(*plVar7 + 0x18))(plVar7);
      }
    }
    else {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      if (node1->ptr == (Node *)0x0) {
        plVar7 = (long *)0x0;
      }
      else {
        plVar7 = (long *)__dynamic_cast(node1->ptr,&Node::typeinfo,&TransformNode::typeinfo,0);
      }
      if (plVar7 == (long *)0x0) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar15,"incompatible scene graph");
        __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      (**(code **)(*plVar7 + 0x10))(plVar7);
      Transformations::add((Transformations *)(plVar6 + 0xd),(Transformations *)(plVar7 + 0xd));
      pNVar1 = (Node *)plVar6[0x13];
      local_38.ptr = pNVar1;
      if (pNVar1 != (Node *)0x0) {
        (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
      }
      pNVar2 = (Node *)plVar7[0x13];
      local_40.ptr = pNVar2;
      if (pNVar2 != (Node *)0x0) {
        (*(pNVar2->super_RefCount)._vptr_RefCount[2])(pNVar2);
      }
      extend_animation(&local_38,&local_40);
      if (pNVar2 != (Node *)0x0) {
        (*(pNVar2->super_RefCount)._vptr_RefCount[3])(pNVar2);
      }
      if (pNVar1 != (Node *)0x0) {
        (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
      }
      (**(code **)(*plVar7 + 0x18))(plVar7);
    }
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x18))(plVar6);
    }
  }
  return;
}

Assistant:

void SceneGraph::extend_animation(Ref<SceneGraph::Node> node0, Ref<SceneGraph::Node> node1)
  {
    if (node0 == node1) return;
      
    if (Ref<SceneGraph::TransformNode> xfmNode0 = node0.dynamicCast<SceneGraph::TransformNode>()) 
    {
      if (Ref<SceneGraph::TransformNode> xfmNode1 = node1.dynamicCast<SceneGraph::TransformNode>()) 
      {
        xfmNode0->spaces.add(xfmNode1->spaces);
        extend_animation(xfmNode0->child, xfmNode1->child);
      } 
      else THROW_RUNTIME_ERROR("incompatible scene graph"); 
    }
    else if (Ref<SceneGraph::GroupNode> groupNode0 = node0.dynamicCast<SceneGraph::GroupNode>()) 
    {
      if (Ref<SceneGraph::GroupNode> groupNode1 = node1.dynamicCast<SceneGraph::GroupNode>()) 
      {
        if (groupNode0->children.size() != groupNode1->children.size()) 
          THROW_RUNTIME_ERROR("incompatible scene graph");

        for (size_t i=0; i<groupNode0->children.size(); i++) 
          extend_animation(groupNode0->children[i],groupNode1->children[i]);
      } 
      else THROW_RUNTIME_ERROR("incompatible scene graph"); 
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh0 = node0.dynamicCast<SceneGraph::TriangleMeshNode>()) 
    {
      if (Ref<SceneGraph::TriangleMeshNode> mesh1 = node1.dynamicCast<SceneGraph::TriangleMeshNode>())
      {
        if (mesh0->numVertices() != mesh1->numVertices())
          THROW_RUNTIME_ERROR("incompatible scene graph");

        for (auto& p : mesh1->positions)
          mesh0->positions.push_back(std::move(p));
      } 
      else THROW_RUNTIME_ERROR("incompatible scene graph"); 
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh0 = node0.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      if (Ref<SceneGraph::QuadMeshNode> mesh1 = node1.dynamicCast<SceneGraph::QuadMeshNode>())
      {
        if (mesh0->numVertices() != mesh1->numVertices())
          THROW_RUNTIME_ERROR("incompatible scene graph");

        for (auto& p : mesh1->positions)
          mesh0->positions.push_back(std::move(p));
      } 
      else THROW_RUNTIME_ERROR("incompatible scene graph"); 
    }
    else if (Ref<SceneGraph::HairSetNode> mesh0 = node0.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      if (Ref<SceneGraph::HairSetNode> mesh1 = node1.dynamicCast<SceneGraph::HairSetNode>()) 
      {
        if (mesh0->numVertices() != mesh1->numVertices())
          THROW_RUNTIME_ERROR("incompatible scene graph");

        for (auto& p : mesh1->positions)
          mesh0->positions.push_back(std::move(p));
      }
      else THROW_RUNTIME_ERROR("incompatible scene graph"); 
    }
    else if (Ref<SceneGraph::PointSetNode> mesh0 = node0.dynamicCast<SceneGraph::PointSetNode>())
    {
      if (Ref<SceneGraph::PointSetNode> mesh1 = node1.dynamicCast<SceneGraph::PointSetNode>())
      {
        if (mesh0->numVertices() != mesh1->numVertices())
          THROW_RUNTIME_ERROR("incompatible scene graph");

        for (auto& p : mesh1->positions)
          mesh0->positions.push_back(std::move(p));
      }
      else THROW_RUNTIME_ERROR("incompatible scene graph");
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh0 = node0.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      if (Ref<SceneGraph::SubdivMeshNode> mesh1 = node1.dynamicCast<SceneGraph::SubdivMeshNode>())
      {
        if (mesh0->numPositions() != mesh1->numPositions())
          THROW_RUNTIME_ERROR("incompatible scene graph");
        if (mesh0->verticesPerFace != mesh1->verticesPerFace)
          THROW_RUNTIME_ERROR("incompatible scene graph");

        for (auto& p : mesh1->positions)
          mesh0->positions.push_back(std::move(p));
      }
      else THROW_RUNTIME_ERROR("incompatible scene graph"); 
    }
  }